

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderLibrary.cpp
# Opt level: O2

vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> * __thiscall
deqp::gls::ShaderLibrary::loadShaderFile
          (vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *__return_storage_ptr__,
          ShaderLibrary *this,char *fileName)

{
  Archive *archive;
  allocator<char> local_61;
  string local_60;
  ShaderCaseFactory local_40;
  TestContext *local_38;
  RenderContext *local_30;
  ContextInfo *pCStack_28;
  
  local_38 = this->m_testCtx;
  local_40._vptr_ShaderCaseFactory = (_func_int **)&PTR_createGroup_00c40f70;
  local_30 = this->m_renderCtx;
  pCStack_28 = this->m_contextInfo;
  archive = local_38->m_curArchive;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,fileName,&local_61);
  glu::sl::parseFile(__return_storage_ptr__,archive,&local_60,&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::vector<tcu::TestNode*> ShaderLibrary::loadShaderFile (const char* fileName)
{
	CaseFactory	caseFactory	(m_testCtx, m_renderCtx, m_contextInfo);

	return glu::sl::parseFile(m_testCtx.getArchive(), fileName, &caseFactory);
}